

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O2

void llvm::logAllUnhandledErrors(Error *E,raw_ostream *OS,Twine ErrorBanner)

{
  ErrorInfoBase *pEVar1;
  _func_int *p_Var2;
  char cVar3;
  ulong uVar4;
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> uVar5;
  ErrorInfoBase EVar6;
  _func_int *p_Var7;
  ulong local_68;
  anon_class_8_1_3fcf62a2 local_60;
  Error local_58;
  _Head_base<0UL,_llvm::ErrorInfoBase_*,_false> local_50;
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> local_48;
  Error local_40;
  pointer local_38;
  
  uVar4 = (ulong)E->Payload & 0xfffffffffffffffe;
  E->Payload = (ErrorInfoBase *)(uVar4 != 0 | uVar4);
  if (uVar4 == 0) {
    return;
  }
  Twine::print(&ErrorBanner,OS);
  pEVar1 = E->Payload;
  E->Payload = (ErrorInfoBase *)0x0;
  EVar6._vptr_ErrorInfoBase = (_func_int **)((ulong)pEVar1 & 0xfffffffffffffffe);
  local_60.OS = OS;
  if (EVar6._vptr_ErrorInfoBase == (_func_int **)0x0) {
    local_40.Payload = (ErrorInfoBase *)0x1;
  }
  else {
    cVar3 = (**(code **)(*EVar6._vptr_ErrorInfoBase + 0x30))(EVar6._vptr_ErrorInfoBase);
    if (cVar3 == '\0') {
      local_48._M_t.
      super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t.
      super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
      super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>,_true,_true>
            )(__uniq_ptr_data<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>,_true,_true>
              )EVar6._vptr_ErrorInfoBase;
      handleErrorImpl<llvm::logAllUnhandledErrors(llvm::Error,llvm::raw_ostream&,llvm::Twine)::__0>
                ((llvm *)&local_40,&local_48,&local_60);
      uVar5._M_t.
      super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t.
      super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
      super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl =
           local_48._M_t.
           super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>.
           _M_t.
           super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
           super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl;
      if (local_48._M_t.
          super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t
          .super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
          super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>)0x0)
      goto LAB_00db8fe8;
    }
    else {
      p_Var2 = EVar6._vptr_ErrorInfoBase[2];
      local_40.Payload = (ErrorInfoBase *)0x1;
      local_38 = (pointer)EVar6._vptr_ErrorInfoBase;
      for (p_Var7 = EVar6._vptr_ErrorInfoBase[1];
          uVar5._M_t.
          super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t
          .super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
          super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl =
               (__uniq_ptr_data<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>,_true,_true>
                )(__uniq_ptr_data<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>,_true,_true>
                  )local_38, p_Var7 != p_Var2; p_Var7 = p_Var7 + 8) {
        local_50._M_head_impl = *(ErrorInfoBase **)p_Var7;
        *(long *)p_Var7 = 0;
        local_58.Payload = local_40.Payload;
        handleErrorImpl<llvm::logAllUnhandledErrors(llvm::Error,llvm::raw_ostream&,llvm::Twine)::__0>
                  ((llvm *)&local_68,
                   (unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)
                   &local_50,&local_60);
        ErrorList::join((ErrorList *)&local_48,&local_58,(Error *)&local_68);
        uVar5._M_t.
        super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t.
        super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
        super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl =
             local_48._M_t.
             super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>.
             _M_t.
             super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>
             .super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl;
        local_48._M_t.
        super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t.
        super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
        super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl =
             (__uniq_ptr_data<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>,_true,_true>
              )(__uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>)0x0;
        if ((long *)(local_68 & 0xfffffffffffffffe) != (long *)0x0) {
          (**(code **)(*(long *)(local_68 & 0xfffffffffffffffe) + 8))();
        }
        if (local_50._M_head_impl != (ErrorInfoBase *)0x0) {
          (*(local_50._M_head_impl)->_vptr_ErrorInfoBase[1])();
        }
        local_50._M_head_impl = (ErrorInfoBase *)0x0;
        if ((long *)((ulong)local_58.Payload & 0xfffffffffffffffe) != (long *)0x0) {
          (**(code **)(*(long *)((ulong)local_58.Payload & 0xfffffffffffffffe) + 8))();
        }
        local_40.Payload =
             (ErrorInfoBase *)
             ((ulong)uVar5._M_t.
                     super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>
                     .super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl | 1);
      }
    }
    (**(code **)(*(_func_int **)
                  uVar5._M_t.
                  super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>
                  .super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl + 8))();
  }
LAB_00db8fe8:
  cantFail(&local_40,(char *)0x0);
  if ((long *)((ulong)local_40.Payload & 0xfffffffffffffffe) != (long *)0x0) {
    (**(code **)(*(long *)((ulong)local_40.Payload & 0xfffffffffffffffe) + 8))();
  }
  return;
}

Assistant:

void logAllUnhandledErrors(Error E, raw_ostream &OS, Twine ErrorBanner) {
  if (!E)
    return;
  OS << ErrorBanner;
  handleAllErrors(std::move(E), [&](const ErrorInfoBase &EI) {
    EI.log(OS);
    OS << "\n";
  });
}